

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O0

int xmlSchemaBuildContentModelForElement(xmlSchemaParserCtxtPtr ctxt,xmlSchemaParticlePtr particle)

{
  xmlSchemaTreeItemPtr_conflict data;
  int counter_00;
  xmlAutomataStatePtr pxVar1;
  bool bVar2;
  int local_4c;
  int local_48;
  int minOccurs;
  int maxOccurs;
  int counter;
  xmlAutomataStatePtr start;
  xmlSchemaElementPtr elemDecl;
  int ret;
  xmlSchemaParticlePtr particle_local;
  xmlSchemaParserCtxtPtr ctxt_local;
  
  if (((ulong)particle->children[2].children & 0x20000) == 0) {
    data = particle->children;
    if (((ulong)data[2].children & 0x10) != 0) {
      return 0;
    }
    if (particle->maxOccurs == 1) {
      _maxOccurs = ctxt->state;
      pxVar1 = xmlAutomataNewTransition2
                         (ctxt->am,_maxOccurs,(xmlAutomataStatePtr)0x0,(xmlChar *)data->next,
                          *(xmlChar **)(data + 3),data);
      ctxt->state = pxVar1;
    }
    else if ((particle->maxOccurs < 0x40000000) || (1 < particle->minOccurs)) {
      if (particle->maxOccurs == 0x40000000) {
        local_48 = 0x40000000;
      }
      else {
        local_48 = particle->maxOccurs + -1;
      }
      if (particle->minOccurs < 1) {
        local_4c = 0;
      }
      else {
        local_4c = particle->minOccurs + -1;
      }
      _maxOccurs = xmlAutomataNewEpsilon(ctxt->am,ctxt->state,(xmlAutomataStatePtr)0x0);
      counter_00 = xmlAutomataNewCounter(ctxt->am,local_4c,local_48);
      pxVar1 = xmlAutomataNewTransition2
                         (ctxt->am,_maxOccurs,(xmlAutomataStatePtr)0x0,(xmlChar *)data->next,
                          *(xmlChar **)(data + 3),data);
      ctxt->state = pxVar1;
      xmlAutomataNewCountedTrans(ctxt->am,ctxt->state,_maxOccurs,counter_00);
      pxVar1 = xmlAutomataNewCounterTrans(ctxt->am,ctxt->state,(xmlAutomataStatePtr)0x0,counter_00);
      ctxt->state = pxVar1;
    }
    else {
      _maxOccurs = ctxt->state;
      pxVar1 = xmlAutomataNewTransition2
                         (ctxt->am,_maxOccurs,(xmlAutomataStatePtr)0x0,(xmlChar *)data->next,
                          *(xmlChar **)(data + 3),data);
      ctxt->state = pxVar1;
      pxVar1 = xmlAutomataNewTransition2
                         (ctxt->am,ctxt->state,ctxt->state,(xmlChar *)data->next,
                          *(xmlChar **)(data + 3),data);
      ctxt->state = pxVar1;
    }
    bVar2 = particle->minOccurs == 0;
    if (bVar2) {
      xmlAutomataNewEpsilon(ctxt->am,_maxOccurs,ctxt->state);
    }
    elemDecl._4_4_ = (uint)bVar2;
  }
  else {
    elemDecl._4_4_ =
         xmlSchemaBuildContentModelForSubstGroup(ctxt,particle,-1,(xmlAutomataStatePtr)0x0);
  }
  return elemDecl._4_4_;
}

Assistant:

static int
xmlSchemaBuildContentModelForElement(xmlSchemaParserCtxtPtr ctxt,
				     xmlSchemaParticlePtr particle)
{
    int ret = 0;

    if (((xmlSchemaElementPtr) particle->children)->flags &
	XML_SCHEMAS_ELEM_SUBST_GROUP_HEAD) {
	/*
	* Substitution groups.
	*/
	ret = xmlSchemaBuildContentModelForSubstGroup(ctxt, particle, -1, NULL);
    } else {
	xmlSchemaElementPtr elemDecl;
	xmlAutomataStatePtr start;

	elemDecl = (xmlSchemaElementPtr) particle->children;

	if (elemDecl->flags & XML_SCHEMAS_ELEM_ABSTRACT)
	    return(0);
	if (particle->maxOccurs == 1) {
	    start = ctxt->state;
	    ctxt->state = xmlAutomataNewTransition2(ctxt->am, start, NULL,
		    elemDecl->name, elemDecl->targetNamespace, elemDecl);
	} else if ((particle->maxOccurs >= UNBOUNDED) &&
	           (particle->minOccurs < 2)) {
	    /* Special case. */
	    start = ctxt->state;
	    ctxt->state = xmlAutomataNewTransition2(ctxt->am, start, NULL,
		elemDecl->name, elemDecl->targetNamespace, elemDecl);
	    ctxt->state = xmlAutomataNewTransition2(ctxt->am, ctxt->state, ctxt->state,
		elemDecl->name, elemDecl->targetNamespace, elemDecl);
	} else {
	    int counter;
	    int maxOccurs = particle->maxOccurs == UNBOUNDED ?
			    UNBOUNDED : particle->maxOccurs - 1;
	    int minOccurs = particle->minOccurs < 1 ?
			    0 : particle->minOccurs - 1;

	    start = xmlAutomataNewEpsilon(ctxt->am, ctxt->state, NULL);
	    counter = xmlAutomataNewCounter(ctxt->am, minOccurs, maxOccurs);
	    ctxt->state = xmlAutomataNewTransition2(ctxt->am, start, NULL,
		elemDecl->name, elemDecl->targetNamespace, elemDecl);
	    xmlAutomataNewCountedTrans(ctxt->am, ctxt->state, start, counter);
	    ctxt->state = xmlAutomataNewCounterTrans(ctxt->am, ctxt->state,
		NULL, counter);
	}
	if (particle->minOccurs == 0) {
	    xmlAutomataNewEpsilon(ctxt->am, start, ctxt->state);
            ret = 1;
        }
    }
    return(ret);
}